

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O3

int Gia_ManSimulateWordsInit(Gia_Man_t *p,Vec_Wrd_t *vSimsIn)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Wrd_t *pVVar6;
  word *pwVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  iVar13 = p->vCis->nSize;
  iVar3 = vSimsIn->nSize / iVar13;
  if (vSimsIn->nSize != iVar13 * iVar3) {
    __assert_fail("Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x75,"int Gia_ManSimulateWordsInit(Gia_Man_t *, Vec_Wrd_t *)");
  }
  pVVar6 = p->vSims;
  if (pVVar6 != (Vec_Wrd_t *)0x0) {
    if (pVVar6->pArray != (word *)0x0) {
      free(pVVar6->pArray);
      p->vSims->pArray = (word *)0x0;
      pVVar6 = p->vSims;
      if (pVVar6 == (Vec_Wrd_t *)0x0) goto LAB_0074954f;
    }
    free(pVVar6);
  }
LAB_0074954f:
  iVar13 = p->nObjs;
  iVar14 = iVar13 * iVar3;
  pVVar6 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar4 = iVar14;
  }
  pVVar6->nCap = iVar4;
  if (iVar4 == 0) {
    pwVar7 = (word *)0x0;
  }
  else {
    pwVar7 = (word *)malloc((long)iVar4 << 3);
  }
  pVVar6->pArray = pwVar7;
  pVVar6->nSize = iVar14;
  memset(pwVar7,0,(long)iVar14 << 3);
  p->vSims = pVVar6;
  p->nSimWords = iVar3;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar11 = (long)iVar3;
    lVar16 = 0;
    lVar15 = 0;
    do {
      iVar4 = pVVar8->pArray[lVar16];
      if ((iVar4 < 0) || (iVar13 = p->nObjs, iVar13 <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar4 == 0) goto LAB_00749678;
      uVar5 = iVar4 * iVar3;
      if (((((int)uVar5 < 0) || (p->vSims->nSize <= (int)uVar5)) || (lVar15 < 0)) ||
         ((long)vSimsIn->nSize <= (lVar15 + lVar11) - lVar11)) goto LAB_007497bc;
      lVar16 = lVar16 + 1;
      memcpy(p->vSims->pArray + uVar5,vSimsIn->pArray + lVar15,lVar11 * 8);
      pVVar8 = p->vCis;
      lVar15 = lVar15 + lVar11;
    } while (lVar16 < pVVar8->nSize);
    iVar13 = p->nObjs;
  }
LAB_00749678:
  if (1 < iVar13) {
    lVar15 = 1;
    do {
      uVar5 = (uint)*(ulong *)(p->pObjs + lVar15);
      uVar9 = *(ulong *)(p->pObjs + lVar15) & 0x1fffffff;
      iVar3 = (int)lVar15;
      if (uVar9 == 0x1fffffff || (int)uVar5 < 0) {
        if ((~uVar5 & 0x9fffffff) != 0) {
          if ((-1 < (int)uVar5) || ((int)uVar9 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                          ,0x86,"int Gia_ManSimulateWordsInit(Gia_Man_t *, Vec_Wrd_t *)");
          }
          uVar1 = p->nSimWords;
          if ((int)(uVar1 * iVar3) < 0) {
LAB_007497bc:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          uVar2 = p->vSims->nSize;
          if ((int)uVar2 <= (int)(uVar1 * iVar3)) goto LAB_007497bc;
          uVar10 = uVar5 & 0x1fffffff;
          uVar12 = (iVar3 - uVar10) * uVar1;
          if (((int)uVar12 < 0) || (uVar2 <= uVar12)) goto LAB_007497bc;
          pwVar7 = p->vSims->pArray;
          if ((uVar5 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar1) {
              uVar9 = 0;
              do {
                pwVar7[uVar1 * iVar3 + uVar9] = pwVar7[(iVar3 - uVar10) * uVar1 + uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar1 != uVar9);
            }
          }
          else if (0 < (int)uVar1) {
            uVar9 = 0;
            do {
              pwVar7[uVar1 * iVar3 + uVar9] = ~pwVar7[(iVar3 - uVar10) * uVar1 + uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
          }
        }
      }
      else {
        Gia_ManObjSimAnd(p,iVar3);
        iVar13 = p->nObjs;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar13);
  }
  return 1;
}

Assistant:

int Gia_ManSimulateWordsInit( Gia_Man_t * p, Vec_Wrd_t * vSimsIn )
{
    Gia_Obj_t * pObj; int i, Id;
    int nWords = Vec_WrdSize(vSimsIn) / Gia_ManCiNum(p);
    assert( Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p) );
    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;
    // set input sim info
    Gia_ManForEachCiId( p, Id, i )
        memcpy( Vec_WrdEntryP(p->vSims, Id*nWords), Vec_WrdEntryP(vSimsIn, i*nWords), sizeof(word)*nWords );
    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManObjSimAnd( p, i );
        else if ( Gia_ObjIsCi(pObj) )
            continue;
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManObjSimPo( p, i );
        else assert( 0 );
    }
    return 1;
}